

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_geti(lua_State *L,int idx,lua_Integer n)

{
  Table *t;
  byte tag;
  TValue *t_00;
  byte bVar1;
  TValue *io;
  TValue key;
  Value local_28;
  undefined1 local_20;
  
  t_00 = index2value(L,idx);
  tag = 0x30;
  if (t_00->tt_ == 'E') {
    t = (Table *)(t_00->value_).gc;
    if (n - 1U < (ulong)t->asize) {
      tag = *(byte *)((long)t->array + n + 3);
      bVar1 = tag & 0xf;
      if (bVar1 != 0) {
        *(byte *)((L->top).offset + 8) = tag;
        (((L->top).p)->val).value_ = t->array[-n];
        goto LAB_00107240;
      }
    }
    else {
      tag = luaH_getint(t,n,&((L->top).p)->val);
      bVar1 = tag & 0xf;
      if (bVar1 != 0) goto LAB_00107240;
    }
  }
  local_20 = 3;
  local_28.i = n;
  bVar1 = luaV_finishget(L,t_00,(TValue *)&local_28,(L->top).p,tag);
  bVar1 = bVar1 & 0xf;
LAB_00107240:
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return (int)bVar1;
}

Assistant:

LUA_API int lua_geti (lua_State *L, int idx, lua_Integer n) {
  TValue *t;
  lu_byte tag;
  lua_lock(L);
  t = index2value(L, idx);
  luaV_fastgeti(t, n, s2v(L->top.p), tag);
  if (tagisempty(tag)) {
    TValue key;
    setivalue(&key, n);
    tag = luaV_finishget(L, t, &key, L->top.p, tag);
  }
  api_incr_top(L);
  lua_unlock(L);
  return novariant(tag);
}